

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

TokenOrSyntax * __thiscall
slang::syntax::NamedPortConnectionSyntax::getChild
          (TokenOrSyntax *__return_storage_ptr__,NamedPortConnectionSyntax *this,size_t index)

{
  Token token;
  Token token_00;
  Token token_01;
  Token token_02;
  SyntaxNode *local_80;
  size_t index_local;
  NamedPortConnectionSyntax *this_local;
  
  switch(index) {
  case 0:
    local_80 = (SyntaxNode *)0x0;
    if (this != (NamedPortConnectionSyntax *)0xfffffffffffffff0) {
      local_80 = &(this->super_PortConnectionSyntax).attributes.super_SyntaxListBase.
                  super_SyntaxNode;
    }
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,local_80);
    break;
  case 1:
    token.kind = (this->dot).kind;
    token._2_1_ = (this->dot).field_0x2;
    token.numFlags.raw = (this->dot).numFlags.raw;
    token.rawLen = (this->dot).rawLen;
    token.info = (this->dot).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token);
    break;
  case 2:
    token_00.kind = (this->name).kind;
    token_00._2_1_ = (this->name).field_0x2;
    token_00.numFlags.raw = (this->name).numFlags.raw;
    token_00.rawLen = (this->name).rawLen;
    token_00.info = (this->name).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token_00);
    break;
  case 3:
    token_01.kind = (this->openParen).kind;
    token_01._2_1_ = (this->openParen).field_0x2;
    token_01.numFlags.raw = (this->openParen).numFlags.raw;
    token_01.rawLen = (this->openParen).rawLen;
    token_01.info = (this->openParen).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token_01);
    break;
  case 4:
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,&this->expr->super_SyntaxNode);
    break;
  case 5:
    token_02.kind = (this->closeParen).kind;
    token_02._2_1_ = (this->closeParen).field_0x2;
    token_02.numFlags.raw = (this->closeParen).numFlags.raw;
    token_02.rawLen = (this->closeParen).rawLen;
    token_02.info = (this->closeParen).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token_02);
    break;
  default:
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

TokenOrSyntax NamedPortConnectionSyntax::getChild(size_t index) {
    switch (index) {
        case 0: return &attributes;
        case 1: return dot;
        case 2: return name;
        case 3: return openParen;
        case 4: return expr;
        case 5: return closeParen;
        default: return nullptr;
    }
}